

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.h
# Opt level: O3

char * __thiscall
NativeCodeData::AllocatorT<InlineeFrameRecord>::AddFixup
          (AllocatorT<InlineeFrameRecord> *this,char *dataBlock)

{
  bool bVar1;
  DataChunk *pDVar2;
  
  if ((this->super_Allocator).isOOPJIT == true) {
    pDVar2 = GetDataChunk(dataBlock);
    pDVar2->fixupFunc = Fixup;
    pDVar2->dataType = "18InlineeFrameRecord";
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,NativeCodeDataPhase);
    if (bVar1) {
      Output::Print(L"NativeCodeData Alloc: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"
                    ,pDVar2,dataBlock,(ulong)pDVar2->allocIndex,(ulong)pDVar2->len,
                    (ulong)pDVar2->offset,pDVar2->dataType);
    }
  }
  return dataBlock;
}

Assistant:

char* AddFixup(char* dataBlock)
        {
            if (isOOPJIT)
            {
                DataChunk* chunk = NativeCodeData::GetDataChunk(dataBlock);
                chunk->fixupFunc = &Fixup;
#if DBG
                chunk->dataType = typeid(T).name();
                if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                {
                    Output::Print(_u("NativeCodeData Alloc: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"),
                        chunk, (void*)dataBlock, chunk->allocIndex, chunk->len, chunk->offset, chunk->dataType);
                }
#endif
            }
            return dataBlock;
        }